

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.c
# Opt level: O2

int xmlCharEncInput(xmlParserInputBufferPtr input,size_t *sizeOut)

{
  xmlBufPtr pxVar1;
  xmlCharEncodingHandler *handler;
  uint uVar2;
  int iVar3;
  size_t sVar4;
  xmlChar *in;
  size_t sVar5;
  xmlChar *out;
  unsigned_long uVar6;
  char cVar7;
  size_t sVar8;
  ulong len;
  long lVar9;
  int c_in;
  int c_out;
  xmlParserInputBufferPtr local_70;
  ulong local_68;
  size_t local_60;
  xmlBufPtr local_58;
  xmlBufPtr local_50;
  size_t *local_48;
  uchar *local_40;
  ulong local_38;
  
  local_58 = input->buffer;
  pxVar1 = input->raw;
  sVar8 = *sizeOut;
  *sizeOut = 0;
  local_70 = input;
  sVar4 = xmlBufUse(pxVar1);
  if (sVar4 != 0) {
    local_50 = pxVar1;
    local_48 = sizeOut;
    in = xmlBufContent(pxVar1);
    len = 0;
    local_60 = 0;
LAB_0012cc73:
    pxVar1 = local_58;
    local_38 = len;
    sVar5 = xmlBufAvail(local_58);
    if (0x3ffffffe < sVar5) {
      sVar5 = 0x3fffffff;
    }
    c_out = (int)sVar8;
    if (sVar5 < sVar8) {
      c_out = (int)sVar5;
    }
    c_in = 0x3fffffff;
    if (sVar4 < 0x40000000) {
      c_in = (int)sVar4;
    }
    handler = local_70->encoder;
    local_68 = sVar8;
    out = xmlBufEnd(pxVar1);
    local_40 = in;
    uVar2 = xmlEncInputChunk(handler,out,&c_out,in,&c_in);
    in = (xmlChar *)(ulong)uVar2;
    lVar9 = (long)c_in;
    sVar8 = (size_t)c_out;
    xmlBufAddLen(pxVar1,sVar8);
    switch(uVar2) {
    case 0xfffffffc:
switchD_0012cd17_caseD_fffffffc:
      iVar3 = 2;
      break;
    case 0xfffffffd:
    case 0:
      len = local_38 + lVar9;
      local_60 = local_60 + sVar8;
      if ((sVar4 < 0x40000000) && (local_68 <= sVar5)) goto LAB_0012cda0;
      cVar7 = (uVar2 == 0 && sVar4 < 0x40000000 || uVar2 == 0xfffffffd && local_68 <= sVar5) *
              '\x03';
      if (((uVar2 != 0 || sVar4 >= 0x40000000) && (uVar2 != 0xfffffffd || local_68 > sVar5)) &&
         (uVar2 == 0xfffffffd)) {
        iVar3 = xmlBufGrow(local_58,0x1000);
        cVar7 = '\0';
        if (iVar3 < 0) {
          in = (uchar *)0xfffffffc;
          goto switchD_0012cd17_caseD_fffffffc;
        }
      }
      in = local_40 + lVar9;
      sVar4 = sVar4 - lVar9;
      sVar8 = local_68 - sVar8;
      if (cVar7 != '\0') goto code_r0x0012cd9b;
      goto LAB_0012cc73;
    case 0xfffffffe:
      iVar3 = 0x51;
      break;
    default:
      iVar3 = 1;
    }
    local_70->error = iVar3;
    goto LAB_0012cdee;
  }
LAB_0012cdce:
  in = (uchar *)0x0;
LAB_0012cdee:
  return (int)in;
code_r0x0012cd9b:
  if (cVar7 != '\x03') goto LAB_0012cdee;
LAB_0012cda0:
  xmlBufShrink(local_50,len);
  uVar6 = 0xffffffffffffffff;
  if (!CARRY8(len,local_70->rawconsumed)) {
    uVar6 = len + local_70->rawconsumed;
  }
  local_70->rawconsumed = uVar6;
  *local_48 = local_60;
  goto LAB_0012cdce;
}

Assistant:

int
xmlCharEncInput(xmlParserInputBufferPtr input, size_t *sizeOut)
{
    xmlBufPtr out, in;
    const xmlChar *dataIn;
    size_t availIn;
    size_t maxOut;
    size_t totalIn, totalOut;
    int ret;

    out = input->buffer;
    in = input->raw;

    maxOut = *sizeOut;
    totalOut = 0;

    *sizeOut = 0;

    availIn = xmlBufUse(in);
    if (availIn == 0)
        return(0);
    dataIn = xmlBufContent(in);
    totalIn = 0;

    while (1) {
        size_t availOut;
        int completeOut, completeIn;
        int c_out, c_in;

        availOut = xmlBufAvail(out);
        if (availOut > INT_MAX / 2)
            availOut = INT_MAX / 2;

        if (availOut < maxOut) {
            c_out = availOut;
            completeOut = 0;
        } else {
            c_out = maxOut;
            completeOut = 1;
        }

        if (availIn > INT_MAX / 2) {
            c_in = INT_MAX / 2;
            completeIn = 0;
        } else {
            c_in = availIn;
            completeIn = 1;
        }

        ret = xmlEncInputChunk(input->encoder, xmlBufEnd(out), &c_out,
                               dataIn, &c_in);

        totalIn += c_in;
        dataIn += c_in;
        availIn -= c_in;

        totalOut += c_out;
        maxOut -= c_out;
        xmlBufAddLen(out, c_out);

        if ((ret != XML_ENC_ERR_SUCCESS) && (ret != XML_ENC_ERR_SPACE)) {
            input->error = xmlEncConvertError(ret);
            return(ret);
        }

        if ((completeOut) && (completeIn))
            break;
        if ((completeOut) && (ret == XML_ENC_ERR_SPACE))
            break;
        if ((completeIn) && (ret == XML_ENC_ERR_SUCCESS))
            break;

        if (ret == XML_ENC_ERR_SPACE) {
            if (xmlBufGrow(out, 4096) < 0) {
                input->error = XML_ERR_NO_MEMORY;
                return(XML_ENC_ERR_MEMORY);
            }
        }
    }

    xmlBufShrink(in, totalIn);

    if (input->rawconsumed > ULONG_MAX - (unsigned long) totalIn)
        input->rawconsumed = ULONG_MAX;
    else
        input->rawconsumed += totalIn;

    *sizeOut = totalOut;
    return(XML_ERR_OK);
}